

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testaniminter.cpp
# Opt level: O2

int main(void)

{
  Am_Input_Char AVar1;
  ushort uVar2;
  ushort uVar3;
  Am_Wrapper *pAVar4;
  Am_Object AVar5;
  Am_Object *pAVar6;
  undefined8 uVar7;
  Am_Value_List *pAVar8;
  ostream *poVar9;
  Am_Value *pAVar10;
  char *pcVar11;
  Am_Constraint *pAVar12;
  long lVar13;
  Am_Value local_1e8;
  Am_Object cmd_1;
  Am_Image_Array icon;
  Am_Object cmd2;
  Am_Object local_1b8 [2];
  Am_Object local_1a8;
  Am_Object local_1a0;
  Am_Object local_198;
  Am_Object local_190;
  Am_Object cmd;
  Am_Object how_set_inter;
  Am_Object local_178;
  Am_Object local_170;
  Am_Object local_168;
  Am_Object local_160;
  Am_Object local_158;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  Am_Object local_138;
  Am_Object local_130;
  Am_Object local_128;
  Am_Object local_120;
  Am_Object local_118;
  Am_Object local_110;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  std::operator<<((ostream *)&std::cout,"General initialize\n");
  std::ostream::flush();
  Am_Initialize();
  Am_Object::Create((char *)&local_1e8);
  uVar2 = Am_Object::Set((ushort)&local_1e8,(char *)0x6c,0x10713d);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x14);
  uVar2 = Am_Object::Set(uVar2,0x66,500);
  uVar2 = Am_Object::Set(uVar2,0x67,0x136);
  AVar5.data = (Am_Object_Data *)Am_Object::Set(uVar2,true,1);
  Am_Object::Create((char *)&icon);
  uVar2 = Am_Object::Set((ushort)&icon,100,10);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  uVar2 = Am_Object::Set(uVar2,0x66,0x28);
  uVar2 = Am_Object::Set(uVar2,0x67,0x28);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  pAVar6 = (Am_Object *)Am_Object::operator=(&rect1,pAVar6);
  Am_Object::Am_Object(&local_60,pAVar6);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_60,0),1);
  Am_Object::Create((char *)local_1b8);
  uVar2 = Am_Object::Set((ushort)local_1b8,100,0x3c);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  uVar2 = Am_Object::Set(uVar2,0x66,0x28);
  uVar2 = Am_Object::Set(uVar2,0x67,0x28);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  pAVar6 = (Am_Object *)Am_Object::operator=(&rect2,pAVar6);
  Am_Object::Am_Object(&local_68,pAVar6);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_68,0),1);
  Am_Object::Create((char *)&cmd_1);
  uVar2 = Am_Object::Set((ushort)&cmd_1,100,0x6e);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  uVar2 = Am_Object::Set(uVar2,0x66,0x28);
  uVar2 = Am_Object::Set(uVar2,0x67,0x28);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  pAVar6 = (Am_Object *)Am_Object::operator=(&rect3,pAVar6);
  Am_Object::Am_Object(&local_70,pAVar6);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_70,0),1);
  Am_Object::Create((char *)&cmd2);
  uVar2 = Am_Object::Set((ushort)&cmd2,100,0xa0);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  uVar2 = Am_Object::Set(uVar2,0x66,0x28);
  uVar2 = Am_Object::Set(uVar2,0x67,0x28);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Orange);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  pAVar6 = (Am_Object *)Am_Object::operator=(&rect4,pAVar6);
  Am_Object::Am_Object(&local_78,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(AVar5,SUB81(&local_78,0),1);
  Am_Object::operator=(&window,pAVar6);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&cmd2);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&cmd_1);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(local_1b8);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object((Am_Object *)&icon);
  Am_Object::~Am_Object((Am_Object *)&local_1e8);
  Am_Object::Create((char *)&local_1e8);
  uVar2 = Am_Object::Set((ushort)&local_1e8,true,1);
  Am_Object::Create((char *)&icon);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)&icon,0xeb,0x67);
  Am_Object::Am_Object(&local_88,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar2,(Am_Object)0xc5,(ulong)&local_88);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim1,pAVar6);
  Am_Object::Am_Object(&local_80,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10a318,SUB81(&local_80,0),1);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object((Am_Object *)&icon);
  Am_Object::~Am_Object((Am_Object *)&local_1e8);
  Am_Object::Create((char *)&icon);
  uVar2 = Am_Object::Set((ushort)&icon,true,1);
  Am_Object::Create((char *)local_1b8);
  uVar3 = Am_Object::Set((ushort)local_1b8,0x11d,2);
  uVar3 = Am_Object::Set(uVar3,0x11e,3);
  local_1e8.value.long_value._4_4_ = 0;
  local_1e8.value.float_value = (float)Am_ANIMATION_BOUNCE.value;
  local_1e8.type = (Am_Value_Type)Am_Animation_End_Action::Am_Animation_End_Action_ID;
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Value *)0xf0,(ulong)&local_1e8);
  Am_Object::Am_Object(&local_98,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar2,(Am_Object)0xc5,(ulong)&local_98);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim2,pAVar6);
  Am_Object::Am_Object(&local_90,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10a320,SUB81(&local_90,0),1);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_98);
  Am_Value::~Am_Value(&local_1e8);
  Am_Object::~Am_Object(local_1b8);
  Am_Object::~Am_Object((Am_Object *)&icon);
  Am_Object::Create((char *)&icon);
  uVar2 = Am_Object::Set((ushort)&icon,true,1);
  Am_Object::Create((char *)local_1b8);
  uVar3 = Am_Object::Set((ushort)local_1b8,0x11d,0xfffffffffffffffc);
  uVar3 = Am_Object::Set(uVar3,0x11e,4);
  local_1e8.value.long_value._4_4_ = 0;
  local_1e8.value.float_value = (float)Am_ANIMATION_WRAP.value;
  local_1e8.type = (Am_Value_Type)Am_Animation_End_Action::Am_Animation_End_Action_ID;
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Value *)0xf0,(ulong)&local_1e8);
  Am_Object::Am_Object(&local_a8,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar2,(Am_Object)0xc5,(ulong)&local_a8);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim3,pAVar6);
  Am_Object::Am_Object(&local_a0,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10a328,SUB81(&local_a0,0),1);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_a8);
  Am_Value::~Am_Value(&local_1e8);
  Am_Object::~Am_Object(local_1b8);
  Am_Object::~Am_Object((Am_Object *)&icon);
  Am_Object::Create((char *)&cmd_1);
  Am_Object::Create((char *)&cmd2);
  uVar2 = Am_Object::Set((ushort)&cmd2,(Am_Method_Wrapper *)0xca,(ulong)my_do.from_wrapper);
  Am_Value_List::Am_Value_List((Am_Value_List *)&local_1e8);
  uVar7 = Am_Value_List::Add(&local_1e8,100,1);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar7,0x65,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xeb,(ulong)pAVar4);
  Am_Value_List::Am_Value_List((Am_Value_List *)&icon);
  uVar7 = Am_Value_List::Add(&icon,0xa0,1);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar7,10,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x181,(ulong)pAVar4);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_1b8);
  uVar7 = Am_Value_List::Add(local_1b8,0x1a4,1);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar7,0x104,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x182,(ulong)pAVar4);
  Am_Time::Am_Time((Am_Time *)&local_190,10000);
  pAVar4 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&local_190);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xec,(ulong)pAVar4);
  Am_Object::Am_Object(&local_b8,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part((ushort)&cmd_1,(Am_Object)0xc5,(ulong)&local_b8);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim4,pAVar6);
  Am_Object::Am_Object(&local_b0,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10a330,SUB81(&local_b0,0),1);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_b8);
  Am_Time::~Am_Time((Am_Time *)&local_190);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_1b8);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&icon);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&local_1e8);
  Am_Object::~Am_Object(&cmd2);
  Am_Object::~Am_Object(&cmd_1);
  Am_Object::Create((char *)&icon);
  Am_Time::Am_Time((Am_Time *)local_1b8,500);
  pAVar4 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)local_1b8);
  uVar2 = Am_Object::Set((ushort)&icon,(Am_Wrapper *)0xe9,(ulong)pAVar4);
  Am_Object::Create((char *)&cmd_1);
  uVar3 = Am_Object::Set((ushort)&cmd_1,0xeb,0x6a);
  Am_Value_List::Am_Value_List((Am_Value_List *)&local_1e8);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar7 = Am_Value_List::Add(&local_1e8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Cyan);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Purple);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Orange);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Gray);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Blue);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Green);
  uVar7 = Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Orange);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar7,pAVar4,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0xed,(ulong)pAVar4);
  Am_Object::Am_Object(&local_c8,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar2,(Am_Object)0xc5,(ulong)&local_c8);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim5,pAVar6);
  Am_Object::Am_Object(&local_c0,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10a318,SUB81(&local_c0,0),1);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_c8);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&local_1e8);
  Am_Object::~Am_Object(&cmd_1);
  Am_Time::~Am_Time((Am_Time *)local_1b8);
  Am_Object::~Am_Object((Am_Object *)&icon);
  Am_Object::Create((char *)&local_1e8);
  Am_Time::Am_Time((Am_Time *)&icon,500);
  pAVar4 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&icon);
  uVar2 = Am_Object::Set((ushort)&local_1e8,(Am_Wrapper *)0xe9,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,true,1);
  Am_Object::Create((char *)&local_d8);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar2,(Am_Object)0xc5,(ulong)&local_d8);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim6,pAVar6);
  Am_Object::Am_Object(&local_d0,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10a328,SUB81(&local_d0,0),1);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::~Am_Object(&local_d8);
  Am_Time::~Am_Time((Am_Time *)&icon);
  Am_Object::~Am_Object((Am_Object *)&local_1e8);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "first one gets taller and changes color, blue bounces,\n");
  std::operator<<(poVar9,"green wraps and blinks, orange goes to corner and stops\n");
  std::ostream::flush();
  Am_Object::Create((char *)&local_1e8);
  uVar2 = Am_Object::Set((ushort)&local_1e8,0xcd,200);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xb9,0x107209);
  Am_Object::Am_Object(&how_set_inter,pAVar6);
  Am_Object::~Am_Object((Am_Object *)&local_1e8);
  cmd.data = (Am_Object_Data *)0x0;
  pAVar10 = (Am_Value *)Am_Object::Get((ushort)&how_set_inter,0xc5);
  Am_Object::operator=(&cmd,pAVar10);
  Am_Object::Set((ushort)&cmd,(Am_Method_Wrapper *)0xca,(ulong)change_setting.from_wrapper);
  Am_Object::Am_Object(&local_e0,&how_set_inter);
  Am_Object::Add_Part((Am_Object)0x10a310,SUB81(&local_e0,0),1);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::Am_Object(&local_e8,&window);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_e8,0),1);
  Am_Object::~Am_Object(&local_e8);
  std::operator<<((ostream *)&std::cout,"Loading pixmaps\n");
  std::ostream::flush();
  Am_Image_Array::Am_Image_Array(&icon);
  for (lVar13 = 0; lVar13 != 0x60; lVar13 = lVar13 + 8) {
    pcVar11 = (char *)Am_Merge_Pathname(*(char **)((long)pixmapfilename + lVar13));
    poVar9 = std::operator<<((ostream *)&std::cout,"Reading image ");
    poVar9 = std::operator<<(poVar9,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::ostream::flush();
    Am_Image_Array::Am_Image_Array((Am_Image_Array *)&local_1e8,pcVar11);
    Am_Image_Array::operator=(&icon,(Am_Image_Array *)&local_1e8);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&local_1e8);
    pAVar4 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&icon);
    Am_Value_List::Add(pixmap_images,pAVar4,1,1);
    if (pcVar11 != (char *)0x0) {
      operator_delete__(pcVar11);
    }
  }
  uVar7 = Am_Value_List::Add(indices_right,0,1);
  uVar7 = Am_Value_List::Add(uVar7,1,1);
  uVar7 = Am_Value_List::Add(uVar7,2,1);
  uVar7 = Am_Value_List::Add(uVar7,3,1);
  uVar7 = Am_Value_List::Add(uVar7,4,1);
  Am_Value_List::Add(uVar7,5,1);
  uVar7 = Am_Value_List::Add(indices_left,6,1);
  uVar7 = Am_Value_List::Add(uVar7,7,1);
  uVar7 = Am_Value_List::Add(uVar7,8,1);
  uVar7 = Am_Value_List::Add(uVar7,9,1);
  uVar7 = Am_Value_List::Add(uVar7,10,1);
  Am_Value_List::Add(uVar7,0xb,1);
  std::operator<<((ostream *)&std::cout,"creating eye icon \n");
  std::ostream::flush();
  Am_Object::Create((char *)&local_1e8);
  uVar2 = Am_Object::Set((ushort)&local_1e8,100,5);
  uVar2 = Am_Object::Set(uVar2,0x65,0x118);
  pAVar4 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&icon);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xb0,(ulong)pAVar4);
  Am_Object::operator=(&eye_icon,pAVar6);
  Am_Object::~Am_Object((Am_Object *)&local_1e8);
  poVar9 = (ostream *)operator<<((ostream *)&std::cout,&eye_icon);
  poVar9 = std::operator<<(poVar9," being added to ");
  poVar9 = (ostream *)operator<<(poVar9,&window);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::ostream::flush();
  Am_Object::Am_Object(local_1b8,&eye_icon);
  Am_Object::Add_Part((Am_Object)0x10a310,SUB81(local_1b8,0),1);
  Am_Object::~Am_Object(local_1b8);
  poVar9 = std::operator<<((ostream *)&std::cout,"done");
  poVar9 = (ostream *)operator<<(poVar9,&window);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::ostream::flush();
  cmd_1.data = (Am_Object_Data *)0x0;
  cmd2.data = (Am_Object_Data *)0x0;
  Am_Object::Create((char *)&local_1a8);
  uVar2 = Am_Object::Set((ushort)&local_1a8,true,1);
  Am_Object::Create((char *)&local_198);
  uVar3 = Am_Object::Set((ushort)&local_198,0x11d,4);
  uVar3 = Am_Object::Set(uVar3,0x11e,0);
  local_1e8.value.long_value._4_4_ = 0;
  local_1e8.value.float_value = (float)Am_ANIMATION_BOUNCE.value;
  local_1e8.type = (Am_Value_Type)Am_Animation_End_Action::Am_Animation_End_Action_ID;
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Value *)0xf0,(ulong)&local_1e8);
  pAVar6 = (Am_Object *)Am_Object::operator=(&cmd_1,pAVar6);
  Am_Object::Am_Object(&local_38,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar2,(Am_Object)0xc5,(ulong)&local_38);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim7,pAVar6);
  Am_Object::Am_Object(&local_190,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10a398,SUB81(&local_190,0),1);
  Am_Object::~Am_Object(&local_190);
  Am_Object::~Am_Object(&local_38);
  Am_Value::~Am_Value(&local_1e8);
  Am_Object::~Am_Object(&local_198);
  Am_Object::~Am_Object(&local_1a8);
  Am_Object::Create((char *)&local_1a8);
  uVar2 = Am_Object::Set((ushort)&local_1a8,0xeb,0xb0);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)pixmap_images);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xed,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,(Am_Method_Wrapper *)0xca,(ulong)my_do.from_wrapper);
  local_1e8.value.long_value._4_4_ = 0;
  local_1e8.value.float_value = (float)Am_ANIMATION_WRAP.value;
  local_1e8.type = (Am_Value_Type)Am_Animation_End_Action::Am_Animation_End_Action_ID;
  uVar2 = Am_Object::Set(uVar2,(Am_Value *)0xf0,(ulong)&local_1e8);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&cmd_1);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x167,(ulong)pAVar4);
  pAVar12 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)which_way);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0xee,(ulong)pAVar12);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  Am_Object::Set((ushort)&cmd_1,(Am_Wrapper *)0x154,(ulong)pAVar4);
  Am_Value::~Am_Value(&local_1e8);
  Am_Object::~Am_Object(&local_1a8);
  Am_Object::Am_Object(&local_1a8,&anim7);
  Am_Object::Am_Object(&local_198,(Am_Object *)&Am_No_Object);
  AVar1 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_40,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_1a8,(Am_Object_Data *)&local_198,AVar1,
                      (Am_Object_Data *)&local_40,0,0,true);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_198);
  Am_Object::~Am_Object(&local_1a8);
  Am_Object::Create((char *)&local_1a0);
  uVar2 = Am_Object::Set((ushort)&local_1a0,(char *)0xb9,0x107458);
  uVar2 = Am_Object::Set(uVar2,(char *)0xbd,0x107467);
  uVar2 = Am_Object::Set(uVar2,true,1);
  Am_Object::Create((char *)&local_58);
  pAVar12 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)plus_or_minus);
  uVar3 = Am_Object::Set((ushort)&local_58,(Am_Constraint *)0x11d,(ulong)pAVar12);
  uVar3 = Am_Object::Set(uVar3,0x11e,0);
  uVar3 = Am_Object::Set(uVar3,(Am_Method_Wrapper *)0xca,(ulong)my_do.from_wrapper);
  local_1e8.value.long_value._4_4_ = 0;
  local_1e8.value.float_value = (float)Am_ANIMATION_STOP.value;
  local_1e8.type = (Am_Value_Type)Am_Animation_End_Action::Am_Animation_End_Action_ID;
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Value *)0xf0,(ulong)&local_1e8);
  pAVar6 = (Am_Object *)Am_Object::operator=(&cmd2,pAVar6);
  Am_Object::Am_Object(&local_50,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar2,(Am_Object)0xc5,(ulong)&local_50);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim8,pAVar6);
  Am_Object::Am_Object(&local_48,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10a398,SUB81(&local_48,0),1);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_50);
  Am_Value::~Am_Value(&local_1e8);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_1a0);
  Am_Object::Create((char *)&local_1a0);
  uVar2 = Am_Object::Set((ushort)&local_1a0,0xeb,0xb0);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)pixmap_images);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xed,(ulong)pAVar4);
  local_1e8.value.long_value._4_4_ = 0;
  local_1e8.value.float_value = (float)Am_ANIMATION_WRAP.value;
  local_1e8.type = (Am_Value_Type)Am_Animation_End_Action::Am_Animation_End_Action_ID;
  uVar2 = Am_Object::Set(uVar2,(Am_Value *)0xf0,(ulong)&local_1e8);
  uVar2 = Am_Object::Set(uVar2,(Am_Method_Wrapper *)0xca,(ulong)my_do.from_wrapper);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&cmd2);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x167,(ulong)pAVar4);
  pAVar12 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)which_way);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0xee,(ulong)pAVar12);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  Am_Object::Set((ushort)&cmd2,(Am_Wrapper *)0x154,(ulong)pAVar4);
  Am_Value::~Am_Value(&local_1e8);
  Am_Object::~Am_Object(&local_1a0);
  Am_Object::~Am_Object(&cmd2);
  Am_Object::~Am_Object(&cmd_1);
  Am_Image_Array::~Am_Image_Array(&icon);
  std::operator<<((ostream *)&std::cout,"Starting interactors\n");
  std::ostream::flush();
  Am_Object::Am_Object(&local_f0,&anim1);
  Am_Object::Am_Object(&local_f8,(Am_Object *)&Am_No_Object);
  AVar1 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_100,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_f0,(Am_Object_Data *)&local_f8,AVar1,
                      (Am_Object_Data *)&local_100,0,0,true);
  Am_Object::~Am_Object(&local_100);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::Am_Object(&local_108,&anim2);
  Am_Object::Am_Object(&local_110,(Am_Object *)&Am_No_Object);
  AVar1 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_118,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_108,(Am_Object_Data *)&local_110,AVar1,
                      (Am_Object_Data *)&local_118,0,0,true);
  Am_Object::~Am_Object(&local_118);
  Am_Object::~Am_Object(&local_110);
  Am_Object::~Am_Object(&local_108);
  Am_Object::Am_Object(&local_120,&anim3);
  Am_Object::Am_Object(&local_128,(Am_Object *)&Am_No_Object);
  AVar1 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_130,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_120,(Am_Object_Data *)&local_128,AVar1,
                      (Am_Object_Data *)&local_130,0,0,true);
  Am_Object::~Am_Object(&local_130);
  Am_Object::~Am_Object(&local_128);
  Am_Object::~Am_Object(&local_120);
  Am_Object::Am_Object(&local_138,&anim4);
  Am_Object::Am_Object(&local_140,(Am_Object *)&Am_No_Object);
  AVar1 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_148,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_138,(Am_Object_Data *)&local_140,AVar1,
                      (Am_Object_Data *)&local_148,0,0,true);
  Am_Object::~Am_Object(&local_148);
  Am_Object::~Am_Object(&local_140);
  Am_Object::~Am_Object(&local_138);
  Am_Object::Am_Object(&local_150,&anim5);
  Am_Object::Am_Object(&local_158,(Am_Object *)&Am_No_Object);
  AVar1 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_160,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_150,(Am_Object_Data *)&local_158,AVar1,
                      (Am_Object_Data *)&local_160,0,0,true);
  Am_Object::~Am_Object(&local_160);
  Am_Object::~Am_Object(&local_158);
  Am_Object::~Am_Object(&local_150);
  Am_Object::Am_Object(&local_168,&anim6);
  Am_Object::Am_Object(&local_170,(Am_Object *)&Am_No_Object);
  AVar1 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_178,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_168,(Am_Object_Data *)&local_170,AVar1,
                      (Am_Object_Data *)&local_178,0,0,true);
  Am_Object::~Am_Object(&local_178);
  Am_Object::~Am_Object(&local_170);
  Am_Object::~Am_Object(&local_168);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&cmd);
  Am_Object::~Am_Object(&how_set_inter);
  return 0;
}

Assistant:

int
main()
{
  std::cout << "General initialize\n" << std::flush;
  Am_Initialize();

  window = Am_Window.Create("window")
               .Set(Am_TITLE, "Test Animation")
               .Set(Am_FILL_STYLE, Am_Yellow)
               .Set(Am_LEFT, 20)
#ifndef _MACINTOSH
               .Set(Am_TOP, 20)
#else
               .Set(Am_TOP, 50)
#endif
               .Set(Am_WIDTH, 500)
               .Set(Am_HEIGHT, 310)
               .Set(Am_DOUBLE_BUFFER, true)
               .Add_Part(rect1 = Am_Rectangle.Create("rect1")
                                     .Set(Am_LEFT, 10)
                                     .Set(Am_TOP, 10)
                                     .Set(Am_WIDTH, 40)
                                     .Set(Am_HEIGHT, 40)
                                     .Set(Am_FILL_STYLE, Am_Red))

               .Add_Part(rect2 = Am_Rectangle.Create("rect2")
                                     .Set(Am_LEFT, 60)
                                     .Set(Am_TOP, 10)
                                     .Set(Am_WIDTH, 40)
                                     .Set(Am_HEIGHT, 40)
                                     .Set(Am_FILL_STYLE, Am_Blue))
               .Add_Part(rect3 = Am_Rectangle.Create("rect3")
                                     .Set(Am_LEFT, 110)
                                     .Set(Am_TOP, 10)
                                     .Set(Am_WIDTH, 40)
                                     .Set(Am_HEIGHT, 40)
                                     .Set(Am_FILL_STYLE, Am_Green))
               .Add_Part(rect4 = Am_Rectangle.Create("rect4")
                                     .Set(Am_LEFT, 160)
                                     .Set(Am_TOP, 10)
                                     .Set(Am_WIDTH, 40)
                                     .Set(Am_HEIGHT, 40)
                                     .Set(Am_FILL_STYLE, Am_Orange));

  rect1.Add_Part(
      anim1 = Am_Animation_Interactor.Create("anim1")
                  .Set(Am_START_WHEN, true)
                  .Set_Part(Am_COMMAND,
                            Am_Incrementer_Animation_Command.Create().Set(
                                Am_SLOT_TO_ANIMATE, Am_HEIGHT)));

  rect2.Add_Part(
      anim2 =
          Am_Animation_Interactor.Create("anim2")
              .Set(Am_START_WHEN, true)
              .Set_Part(Am_COMMAND,
                        Am_Animation_Object_In_Owner_Command.Create()
                            .Set(Am_X_OFFSET, 2)
                            .Set(Am_Y_OFFSET, 3)
                            .Set(Am_ANIMATE_END_ACTION, Am_ANIMATION_BOUNCE)));

  rect3.Add_Part(
      anim3 =
          Am_Animation_Interactor.Create("anim3")
              .Set(Am_START_WHEN, true)
              .Set_Part(Am_COMMAND,
                        Am_Animation_Object_In_Owner_Command.Create()
                            .Set(Am_X_OFFSET, -4)
                            .Set(Am_Y_OFFSET, 4)
                            .Set(Am_ANIMATE_END_ACTION, Am_ANIMATION_WRAP)));

  rect4.Add_Part(
      anim4 = Am_Animation_Interactor.Create("anim4").Set_Part(
          Am_COMMAND,
          Am_Animator_Animation_Command.Create()
              .Set(Am_DO_METHOD, my_do)
              .Set(Am_SLOT_TO_ANIMATE, Am_Value_List().Add(Am_LEFT).Add(Am_TOP))
              .Set(Am_VALUE_1, Am_Value_List().Add(160).Add(10))
              .Set(Am_VALUE_2, Am_Value_List().Add(420).Add(260))
              .Set(Am_TIME_FOR_ANIMATION, Am_Time(10000)) //milliseconds
          ));
  rect1.Add_Part(
      anim5 =
          Am_Animation_Interactor
              .Create("anim5")
              //change every 1/2 second
              .Set(Am_REPEAT_DELAY, Am_Time(500))
              .Set_Part(Am_COMMAND, Am_Animation_Through_List_Command.Create()
                                        .Set(Am_SLOT_TO_ANIMATE, Am_FILL_STYLE)
                                        .Set(Am_VALUES_FOR_SLOT_TO_ANIMATE,
                                             Am_Value_List()
                                                 .Add(Am_Red)
                                                 .Add(Am_Blue)
                                                 .Add(Am_Cyan)
                                                 .Add(Am_Purple)
                                                 .Add(Am_Orange)
                                                 .Add(Am_Green)
                                                 .Add(Am_Yellow)
                                                 .Add(Am_Black)
                                                 .Add(Am_White)
                                                 .Add(Am_Amulet_Purple)
                                                 .Add(Am_Motif_Light_Gray)
                                                 .Add(Am_Motif_Light_Blue)
                                                 .Add(Am_Motif_Light_Green)
                                                 .Add(Am_Motif_Light_Orange))));
  rect3.Add_Part(
      anim6 = Am_Animation_Interactor
                  .Create("anim6")
                  //change every 1/2 second
                  .Set(Am_REPEAT_DELAY, Am_Time(500))
                  .Set(Am_START_WHEN, true)
                  .Set_Part(Am_COMMAND, Am_Animation_Blink_Command.Create()));

  std::cout << "first one gets taller and changes color, blue bounces,\n"
            << "green wraps and blinks, orange goes to corner and stops\n"
            << std::flush;

  Am_Object how_set_inter =
      Am_One_Shot_Interactor.Create("change_settings")
          .Set(Am_PRIORITY, 200) //higher than normal running
          .Set(Am_START_WHEN, "ANY_KEYBOARD");
  Am_Object cmd;
  cmd = how_set_inter.Get(Am_COMMAND);
  cmd.Set(Am_DO_METHOD, change_setting);
  window.Add_Part(how_set_inter);
  Am_Screen.Add_Part(window);

  std::cout << "Loading pixmaps\n" << std::flush;
  init_pixmaps();

  std::cout << "Starting interactors\n" << std::flush;

  Am_Start_Interactor(anim1);
  Am_Start_Interactor(anim2);
  Am_Start_Interactor(anim3);
  Am_Start_Interactor(anim4);
  Am_Start_Interactor(anim5);
  Am_Start_Interactor(anim6);

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}